

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O1

int get_dsc_leb_entries(Dwarf_Debug dbg,Dwarf_Small *blockpointer,Dwarf_Unsigned blocklen,
                       int dounsigned,Dwarf_Dsc_Entry_s *ary,size_t *arraycount,Dwarf_Error *error)

{
  Dwarf_Unsigned DVar1;
  char cVar2;
  int iVar3;
  Dwarf_Unsigned DVar4;
  Dwarf_Unsigned DVar5;
  ulong uVar6;
  Dwarf_Small *endptr;
  ulong uVar7;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned local_60;
  Dwarf_Unsigned local_58;
  Dwarf_Debug local_50;
  ulong local_48;
  Dwarf_Unsigned local_40;
  ulong *local_38;
  
  uVar6 = *arraycount;
  local_50 = dbg;
  if (ary == (Dwarf_Dsc_Entry_s *)0x0) {
    if (uVar6 != 0) goto LAB_0015b0c0;
  }
  else if (uVar6 == 0) goto LAB_0015b0c0;
  endptr = blockpointer + blocklen;
  local_48 = uVar6;
  local_38 = arraycount;
  if (dounsigned == 0) {
    uVar7 = 0;
    while (blockpointer < endptr) {
      if (uVar7 < uVar6 || ary == (Dwarf_Dsc_Entry_s *)0x0) {
        local_58 = 0;
        local_60 = 0;
        iVar3 = dwarf_decode_signed_leb128
                          ((char *)blockpointer,&local_58,(Dwarf_Signed *)&local_60,(char *)endptr);
        DVar1 = local_60;
        if (iVar3 == 1) {
          _dwarf_error_string(local_50,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f");
LAB_0015b084:
          DVar4 = 0;
        }
        else {
          blockpointer = blockpointer + local_58;
          if (local_60 != 0) {
            local_58 = 0;
            local_60 = 0;
            iVar3 = dwarf_decode_signed_leb128
                              ((char *)blockpointer,&local_58,(Dwarf_Signed *)&local_60,
                               (char *)endptr);
            if (iVar3 == 1) {
              _dwarf_error_string(local_50,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f"
                                 );
            }
            else {
              blockpointer = blockpointer + local_58;
              local_40 = local_60;
              local_58 = 0;
              local_60 = 0;
              iVar3 = dwarf_decode_signed_leb128
                                ((char *)blockpointer,&local_58,(Dwarf_Signed *)&local_60,
                                 (char *)endptr);
              if (iVar3 != 1) {
                blockpointer = blockpointer + local_58;
                DVar4 = local_60;
                DVar5 = local_40;
                goto LAB_0015b095;
              }
              _dwarf_error_string(local_50,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f"
                                 );
            }
            goto LAB_0015b084;
          }
          local_58 = 0;
          local_60 = 0;
          iVar3 = dwarf_decode_signed_leb128
                            ((char *)blockpointer,&local_58,(Dwarf_Signed *)&local_60,(char *)endptr
                            );
          if (iVar3 == 1) {
            _dwarf_error_string(local_50,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f");
            DVar5 = 0;
          }
          else {
            blockpointer = blockpointer + local_58;
            DVar5 = local_60;
          }
          DVar4 = 0;
          if (iVar3 != 1) {
LAB_0015b095:
            if (ary != (Dwarf_Dsc_Entry_s *)0x0) {
              ary[uVar7].dsc_type = (Dwarf_Half)DVar1;
              ary[uVar7].dsc_low_s = DVar5;
              ary[uVar7].dsc_high_s = DVar4;
            }
            uVar7 = uVar7 + 1;
            DVar4 = 1;
          }
        }
        cVar2 = (char)DVar4;
        uVar6 = local_48;
      }
      else {
        _dwarf_error(local_50,error,0x161);
        cVar2 = '\0';
      }
      if (cVar2 == '\0') {
        return 1;
      }
    }
  }
  else {
    uVar7 = 0;
    while (blockpointer < endptr) {
      if (uVar7 < uVar6 || ary == (Dwarf_Dsc_Entry_s *)0x0) {
        local_58 = 0;
        local_60 = 0;
        iVar3 = dwarf_decode_leb128((char *)blockpointer,&local_58,&local_60,(char *)endptr);
        DVar1 = local_60;
        if (iVar3 == 1) {
          _dwarf_error_string(local_50,error,0x149,
                              "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
LAB_0015aea5:
          DVar4 = 0;
        }
        else {
          blockpointer = blockpointer + local_58;
          if (local_60 != 0) {
            local_58 = 0;
            local_60 = 0;
            iVar3 = dwarf_decode_leb128((char *)blockpointer,&local_58,&local_60,(char *)endptr);
            if (iVar3 == 1) {
              _dwarf_error_string(local_50,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            }
            else {
              blockpointer = blockpointer + local_58;
              local_40 = local_60;
              local_58 = 0;
              local_60 = 0;
              iVar3 = dwarf_decode_leb128((char *)blockpointer,&local_58,&local_60,(char *)endptr);
              if (iVar3 != 1) {
                blockpointer = blockpointer + local_58;
                DVar4 = local_60;
                DVar5 = local_40;
                goto LAB_0015aeb9;
              }
              _dwarf_error_string(local_50,error,0x149,
                                  "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            }
            goto LAB_0015aea5;
          }
          local_58 = 0;
          local_60 = 0;
          iVar3 = dwarf_decode_leb128((char *)blockpointer,&local_58,&local_60,(char *)endptr);
          if (iVar3 == 1) {
            _dwarf_error_string(local_50,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            DVar5 = 0;
          }
          else {
            blockpointer = blockpointer + local_58;
            DVar5 = local_60;
          }
          DVar4 = 0;
          if (iVar3 != 1) {
LAB_0015aeb9:
            if (ary != (Dwarf_Dsc_Entry_s *)0x0) {
              ary[uVar7].dsc_type = (Dwarf_Half)DVar1;
              ary[uVar7].dsc_low_u = DVar5;
              ary[uVar7].dsc_high_u = DVar4;
            }
            uVar7 = uVar7 + 1;
            DVar4 = 1;
          }
        }
        cVar2 = (char)DVar4;
        uVar6 = local_48;
      }
      else {
        _dwarf_error(local_50,error,0x161);
        cVar2 = '\0';
      }
      if (cVar2 == '\0') {
        return 1;
      }
    }
  }
  if (ary == (Dwarf_Dsc_Entry_s *)0x0) {
    *local_38 = uVar7;
    return 0;
  }
  if (uVar6 == uVar7) {
    return 0;
  }
LAB_0015b0c0:
  _dwarf_error(local_50,error,0x161);
  return 1;
}

Assistant:

static int
get_dsc_leb_entries(Dwarf_Debug dbg,
    Dwarf_Small    * blockpointer,
    Dwarf_Unsigned   blocklen,
    int dounsigned,
    struct Dwarf_Dsc_Entry_s *ary,
    size_t         * arraycount,
    Dwarf_Error    * error)
{
    Dwarf_Small *p = blockpointer;
    Dwarf_Small *endp = blockpointer + blocklen;
    size_t larraycount = 0;
    size_t iarraycount = *arraycount;

    if (!ary) {
        if (iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    } else {
        if (!iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    }
    if (dounsigned) {
        while (p < endp)  {
            Dwarf_Unsigned dsc = 0;
            Dwarf_Unsigned low = 0;
            Dwarf_Unsigned high = 0;

            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_UWORD_CK(p,dsc,
                dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
            } else {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
                DECODE_LEB128_UWORD_CK(p,high,
                    dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_u = low;
                arye->dsc_high_u = high;
            }
            larraycount++;
        }
    } else {
        while (p < endp)  {
            Dwarf_Signed dsc = 0;
            Dwarf_Signed low = 0;
            Dwarf_Signed high = 0;
            Dwarf_Unsigned leblen = 0;

            (void)leblen;
            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_SWORD_LEN_CK(p,dsc,
                leblen,dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
            } else {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
                DECODE_LEB128_SWORD_LEN_CK(p,high,
                    leblen,dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_s = low;
                arye->dsc_high_s = high;
            }
            larraycount++;
        }
    }
    if (ary) {
        /*  Just verify this recount matches original */
        if (iarraycount != larraycount) {
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        }
    } else {
        /*  This matters for first call with
            ary 0 and iarraycount 0 as we are generating the
            count. */
        *arraycount = larraycount;
    }
    return DW_DLV_OK;
}